

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::AddLeftDead
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  JavascriptString *pJVar9;
  JavascriptString *pstRight;
  Var pvVar10;
  double dVar11;
  double dVar12;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_0099199d;
    *puVar7 = 0;
  }
  bVar3 = TaggedInt::Is(aLeft);
  if ((ulong)aLeft >> 0x32 != 0 || bVar3) {
LAB_0099177c:
    bVar3 = false;
  }
  else {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0099199d;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar6 = RecyclableObject::IsExternal(pRVar8);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_0099199d:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      goto LAB_0099177c;
    }
    if (TVar1 != TypeIds_String) goto LAB_0099177c;
    pJVar9 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    if (aRight == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0099199d;
      *puVar7 = 0;
    }
    bVar3 = TaggedInt::Is(aRight);
    if (bVar3) {
LAB_00991710:
      pstRight = ScriptContext::GetIntegerString(scriptContext,aRight);
LAB_00991884:
      pJVar9 = JavascriptString::ConcatDestructive(pJVar9,pstRight);
      return pJVar9;
    }
    if ((Var)0x3ffffffffffff < aRight) {
LAB_00991874:
      dVar12 = JavascriptNumber::GetValue(aRight);
      pstRight = JavascriptNumber::ToStringRadix10(dVar12,scriptContext);
      goto LAB_00991884;
    }
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_0099199d;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar1) {
      BVar6 = RecyclableObject::IsExternal(pRVar8);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_0099199d;
        *puVar7 = 0;
      }
    }
    if (TVar1 == TypeIds_FirstNumberType) goto LAB_00991710;
    if (TVar1 == TypeIds_Number) goto LAB_00991874;
    bVar3 = true;
    if (TVar1 == TypeIds_String) {
      pstRight = UnsafeVarTo<Js::JavascriptString>(aRight);
      goto LAB_00991884;
    }
  }
  bVar4 = TaggedInt::Is(aLeft);
  bVar5 = TaggedInt::Is(aRight);
  if (bVar4) {
    if (bVar5) {
      pvVar10 = TaggedInt::Add(aLeft,aRight,scriptContext);
      return pvVar10;
    }
    if (aRight < (Var)0x4000000000000) goto LAB_00991841;
    dVar12 = (double)(int)aLeft;
  }
  else {
    if (bVar5) {
      if (aLeft < (Var)0x4000000000000) {
LAB_00991841:
        pvVar10 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,bVar3);
        return pvVar10;
      }
      dVar11 = JavascriptNumber::GetValue(aLeft);
      dVar11 = dVar11 + (double)(int)aRight;
      goto LAB_00991827;
    }
    if (aRight < (Var)0x4000000000000 || aLeft < (Var)0x4000000000000) goto LAB_00991841;
    dVar12 = JavascriptNumber::GetValue(aLeft);
  }
  dVar11 = JavascriptNumber::GetValue(aRight);
  dVar11 = dVar11 + dVar12;
LAB_00991827:
  pvVar10 = JavascriptNumber::ToVarMaybeInPlace(dVar11,scriptContext,result);
  return pvVar10;
}

Assistant:

Var JavascriptMath::AddLeftDead(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber *result)
        {
            // Conservatively assume src1 is not dead until proven otherwise.
            bool leftIsDead = false;

            JIT_HELPER_REENTRANT_HEADER(Op_AddLeftDead);
            if (JavascriptOperators::GetTypeId(aLeft) == TypeIds_String)
            {
                leftIsDead = true;

                JavascriptString* leftString = UnsafeVarTo<JavascriptString>(aLeft);
                JavascriptString* rightString;
                TypeId rightType = JavascriptOperators::GetTypeId(aRight);
                switch(rightType)
                {
                    case TypeIds_String:
                        rightString = UnsafeVarTo<JavascriptString>(aRight);

StringCommon:
                        return leftString->ConcatDestructive(rightString);

                    case TypeIds_Integer:
                        rightString = scriptContext->GetIntegerString(aRight);
                        goto StringCommon;

                    case TypeIds_Number:
                        rightString = JavascriptNumber::ToStringRadix10(JavascriptNumber::GetValue(aRight), scriptContext);
                        goto StringCommon;
                }
            }

            if (TaggedInt::Is(aLeft))
            {
                if (TaggedInt::Is(aRight))
                {
                    return TaggedInt::Add(aLeft, aRight, scriptContext);
                }
                else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if (TaggedInt::Is(aRight))
            {
                if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
            }
            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, leftIsDead);
            JIT_HELPER_END(Op_AddLeftDead);
        }